

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glauber.cxx
# Opt level: O2

int main(int argc,char **argv)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  uint uVar2;
  bool bVar3;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar4;
  char *pcVar5;
  typed_value<int,_char> *ptVar6;
  typed_value<std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>,_char>
  *ptVar7;
  typed_value<boost::filesystem::path,_char> *ptVar8;
  typed_value<double,_char> *ptVar9;
  typed_value<long,_char> *ptVar10;
  options_description *poVar11;
  basic_command_line_parser<char> *this;
  size_type sVar12;
  ostream *poVar13;
  any *operand;
  vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *pvVar14;
  error *this_00;
  uint uVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  allocator local_99c;
  allocator local_99b;
  allocator local_99a;
  allocator local_999;
  allocator local_998;
  allocator local_997;
  allocator local_996;
  allocator local_995;
  allocator local_994;
  allocator local_993;
  allocator local_992;
  allocator local_991;
  allocator local_990;
  allocator local_98f;
  allocator local_98e;
  allocator local_98d;
  int local_98c;
  string usage_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_968;
  char **local_940;
  long local_938;
  double local_930;
  double local_928;
  double local_920;
  double local_918;
  double local_910;
  double local_908;
  double local_900;
  undefined8 local_8f8;
  VarMap var_map;
  undefined4 uStack_8ec;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_8e0 [144];
  string local_850;
  string local_830 [32];
  string local_810;
  string local_7f0 [32];
  OptDesc config_file_opts;
  string local_750;
  string local_730 [32];
  string local_710;
  string local_6f0 [32];
  OptDesc usage_opts;
  OptDesc all_opts;
  function1<void,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_5d0;
  positional_options_description positional_opts;
  Collider collider;
  OptDesc grid_opts;
  OptDesc phys_opts;
  OptDesc output_opts;
  OptDesc general_opts;
  OptDesc main_opts;
  
  uVar2 = (uint)boost::program_options::options_description::m_default_line_length;
  uVar15 = (uint)boost::program_options::options_description::m_default_line_length >> 1;
  local_98c = argc;
  local_940 = argv;
  boost::program_options::options_description::options_description
            (&main_opts,(uint)boost::program_options::options_description::m_default_line_length,
             uVar15);
  collider.nucleusA_._M_t.
  super___uniq_ptr_impl<glauber::Nucleus,_std::default_delete<glauber::Nucleus>_>._M_t.
  super__Tuple_impl<0UL,_glauber::Nucleus_*,_std::default_delete<glauber::Nucleus>_>.
  super__Head_base<0UL,_glauber::Nucleus_*,_false>._M_head_impl =
       (__uniq_ptr_data<glauber::Nucleus,_std::default_delete<glauber::Nucleus>,_true,_true>)
       boost::program_options::options_description::add_options();
  ptVar4 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  ptVar4->m_required = true;
  local_5d0.super_function_base.vtable =
       (vtable_base *)
       (boost::
        function1<void,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
        ::assign_to<main::$_0>(main::$_0)::stored_vtable_abi_cxx11_ + 1);
  boost::
  function1<void,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::operator=(&ptVar4->m_notifier,&local_5d0);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&collider,(value_semantic *)"projectile",(char *)ptVar4);
  ptVar6 = boost::program_options::value<int>();
  _var_map = 1;
  ptVar6 = boost::program_options::typed_value<int,_char>::default_value(ptVar6,(int *)&var_map);
  boost::program_options::options_description_easy_init::operator()
            (pcVar5,(value_semantic *)"number-events",(char *)ptVar6);
  boost::
  function1<void,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1(&local_5d0);
  boost::program_options::positional_options_description::positional_options_description
            (&positional_opts);
  pcVar5 = (char *)boost::program_options::positional_options_description::add
                             ((char *)&positional_opts,0x135040);
  boost::program_options::positional_options_description::add(pcVar5,0x13505e);
  std::__cxx11::string::string((string *)&collider,"general options",(allocator *)&var_map);
  boost::program_options::options_description::options_description
            (&general_opts,(string *)&collider,uVar2,uVar15);
  std::__cxx11::string::~string((string *)&collider);
  _var_map = (pointer)boost::program_options::options_description::add_options();
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&var_map,"help,h");
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,"version");
  ptVar7 = boost::program_options::
           value<std::vector<boost::filesystem::path,std::allocator<boost::filesystem::path>>>();
  std::__cxx11::string::string((string *)&collider,"FILE",(allocator *)&output_opts);
  std::__cxx11::string::_M_assign((string *)&ptVar7->m_value_name);
  boost::program_options::options_description_easy_init::operator()
            (pcVar5,(value_semantic *)"config-file,c",(char *)ptVar7);
  std::__cxx11::string::~string((string *)&collider);
  std::__cxx11::string::string((string *)&collider,"output options",(allocator *)&var_map);
  boost::program_options::options_description::options_description
            (&output_opts,(string *)&collider,uVar2,uVar15);
  std::__cxx11::string::~string((string *)&collider);
  _var_map = (pointer)boost::program_options::options_description::add_options();
  pcVar5 = (char *)boost::program_options::bool_switch();
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&var_map,(value_semantic *)"quiet,q",pcVar5);
  ptVar8 = boost::program_options::value<boost::filesystem::path>();
  std::__cxx11::string::string((string *)&collider,"PATH",(allocator *)&phys_opts);
  std::__cxx11::string::_M_assign((string *)&ptVar8->m_value_name);
  boost::program_options::options_description_easy_init::operator()
            (pcVar5,(value_semantic *)"output,o",(char *)ptVar8);
  std::__cxx11::string::~string((string *)&collider);
  std::__cxx11::string::string((string *)&collider,"physical options",(allocator *)&var_map);
  boost::program_options::options_description::options_description
            (&phys_opts,(string *)&collider,uVar2,uVar15);
  std::__cxx11::string::~string((string *)&collider);
  local_8f8 = boost::program_options::options_description::add_options();
  ptVar9 = boost::program_options::value<double>();
  std::__cxx11::string::string((string *)&collider,"FLOAT",&local_98d);
  std::__cxx11::string::_M_assign((string *)&ptVar9->m_value_name);
  local_900 = 0.0;
  std::__cxx11::string::string((string *)&var_map,"0",&local_98e);
  ptVar9 = boost::program_options::typed_value<double,_char>::default_value
                     (ptVar9,&local_900,(string *)&var_map);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_8f8,(value_semantic *)"alpha,a",(char *)ptVar9);
  ptVar9 = boost::program_options::value<double>();
  std::__cxx11::string::string((string *)&grid_opts,"FLOAT",&local_98f);
  std::__cxx11::string::_M_assign((string *)&ptVar9->m_value_name);
  local_908 = 1.0;
  std::__cxx11::string::string((string *)&usage_opts,"1",&local_990);
  ptVar9 = boost::program_options::typed_value<double,_char>::default_value
                     (ptVar9,&local_908,(string *)&usage_opts);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"fluctuation,k",(char *)ptVar9);
  ptVar9 = boost::program_options::value<double>();
  std::__cxx11::string::string((string *)&all_opts,"FLOAT",&local_991);
  std::__cxx11::string::_M_assign((string *)&ptVar9->m_value_name);
  local_910 = 0.5;
  std::__cxx11::string::string((string *)&config_file_opts,"0.5",&local_992);
  ptVar9 = boost::program_options::typed_value<double,_char>::default_value
                     (ptVar9,&local_910,(string *)&config_file_opts);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"nucleon-width,w",(char *)ptVar9);
  ptVar9 = boost::program_options::value<double>();
  std::__cxx11::string::string((string *)&local_968,"FLOAT",&local_993);
  std::__cxx11::string::_M_assign((string *)&ptVar9->m_value_name);
  local_918 = 6.4;
  std::__cxx11::string::string((string *)&usage_str,"6.4",&local_994);
  ptVar9 = boost::program_options::typed_value<double,_char>::default_value
                     (ptVar9,&local_918,&usage_str);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"cross-section,x",(char *)ptVar9);
  ptVar9 = boost::program_options::value<double>();
  std::__cxx11::string::string(local_7f0,"FLOAT",&local_995);
  std::__cxx11::string::_M_assign((string *)&ptVar9->m_value_name);
  local_920 = 1.0;
  std::__cxx11::string::string((string *)&local_810,"1",&local_996);
  ptVar9 = boost::program_options::typed_value<double,_char>::default_value
                     (ptVar9,&local_920,&local_810);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"normalization,n",(char *)ptVar9);
  ptVar9 = boost::program_options::value<double>();
  std::__cxx11::string::string(local_830,"FLOAT",&local_997);
  std::__cxx11::string::_M_assign((string *)&ptVar9->m_value_name);
  local_928 = 0.0;
  std::__cxx11::string::string((string *)&local_850,"0",&local_998);
  ptVar9 = boost::program_options::typed_value<double,_char>::default_value
                     (ptVar9,&local_928,&local_850);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"b-min",(char *)ptVar9);
  ptVar9 = boost::program_options::value<double>();
  std::__cxx11::string::string(local_6f0,"FLOAT",&local_999);
  std::__cxx11::string::_M_assign((string *)&ptVar9->m_value_name);
  local_930 = -1.0;
  std::__cxx11::string::string((string *)&local_710,"auto",&local_99a);
  ptVar9 = boost::program_options::typed_value<double,_char>::default_value
                     (ptVar9,&local_930,&local_710);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"b-max",(char *)ptVar9);
  ptVar10 = boost::program_options::value<long>();
  std::__cxx11::string::string(local_730,"INT",&local_99b);
  std::__cxx11::string::_M_assign((string *)&ptVar10->m_value_name);
  local_938 = -1;
  std::__cxx11::string::string((string *)&local_750,"auto",&local_99c);
  ptVar10 = boost::program_options::typed_value<long,_char>::default_value
                      (ptVar10,&local_938,&local_750);
  boost::program_options::options_description_easy_init::operator()
            (pcVar5,(value_semantic *)"random-seed",(char *)ptVar10);
  std::__cxx11::string::~string((string *)&local_750);
  std::__cxx11::string::~string(local_730);
  std::__cxx11::string::~string((string *)&local_710);
  std::__cxx11::string::~string(local_6f0);
  std::__cxx11::string::~string((string *)&local_850);
  std::__cxx11::string::~string(local_830);
  std::__cxx11::string::~string((string *)&local_810);
  std::__cxx11::string::~string(local_7f0);
  std::__cxx11::string::~string((string *)&usage_str);
  std::__cxx11::string::~string((string *)&local_968);
  std::__cxx11::string::~string((string *)&config_file_opts);
  std::__cxx11::string::~string((string *)&all_opts);
  std::__cxx11::string::~string((string *)&usage_opts);
  std::__cxx11::string::~string((string *)&grid_opts);
  std::__cxx11::string::~string((string *)&var_map);
  std::__cxx11::string::~string((string *)&collider);
  std::__cxx11::string::string((string *)&collider,"grid options",(allocator *)&var_map);
  boost::program_options::options_description::options_description
            (&grid_opts,(string *)&collider,uVar2,uVar15);
  std::__cxx11::string::~string((string *)&collider);
  _config_file_opts = (pointer)boost::program_options::options_description::add_options();
  ptVar9 = boost::program_options::value<double>();
  std::__cxx11::string::string((string *)&collider,"FLOAT",(allocator *)local_7f0);
  std::__cxx11::string::_M_assign((string *)&ptVar9->m_value_name);
  local_968._M_dataplus._M_p = (pointer)0x4024000000000000;
  std::__cxx11::string::string((string *)&var_map,"10.0",(allocator *)&local_810);
  ptVar9 = boost::program_options::typed_value<double,_char>::default_value
                     (ptVar9,(double *)&local_968,(string *)&var_map);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&config_file_opts,(value_semantic *)"grid-max",(char *)ptVar9)
  ;
  ptVar9 = boost::program_options::value<double>();
  std::__cxx11::string::string((string *)&usage_opts,"FLOAT",(allocator *)local_830);
  std::__cxx11::string::_M_assign((string *)&ptVar9->m_value_name);
  usage_str._M_dataplus._M_p = (pointer)0x3fc999999999999a;
  std::__cxx11::string::string((string *)&all_opts,"0.2",(allocator *)&local_850);
  ptVar9 = boost::program_options::typed_value<double,_char>::default_value
                     (ptVar9,(double *)&usage_str,(string *)&all_opts);
  boost::program_options::options_description_easy_init::operator()
            (pcVar5,(value_semantic *)"grid-step",(char *)ptVar9);
  std::__cxx11::string::~string((string *)&all_opts);
  std::__cxx11::string::~string((string *)&usage_opts);
  std::__cxx11::string::~string((string *)&var_map);
  std::__cxx11::string::~string((string *)&collider);
  boost::program_options::options_description::options_description(&usage_opts,uVar2,uVar15);
  poVar11 = (options_description *)boost::program_options::options_description::add(&usage_opts);
  poVar11 = (options_description *)boost::program_options::options_description::add(poVar11);
  poVar11 = (options_description *)boost::program_options::options_description::add(poVar11);
  boost::program_options::options_description::add(poVar11);
  boost::program_options::options_description::options_description(&all_opts,uVar2,uVar15);
  poVar11 = (options_description *)boost::program_options::options_description::add(&all_opts);
  boost::program_options::options_description::add(poVar11);
  std::__cxx11::string::string
            ((string *)&usage_str,
             "usage: glauber [options] projectile projectile [number-events = 1]\n",
             (allocator *)&collider);
  boost::program_options::variables_map::variables_map(&var_map);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)&collider,local_98c,local_940);
  this = boost::program_options::basic_command_line_parser<char>::options
                   ((basic_command_line_parser<char> *)&collider,&all_opts);
  boost::program_options::detail::cmdline::set_positional_options
            ((positional_options_description *)this);
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)&config_file_opts,this);
  boost::program_options::store(&config_file_opts,&var_map,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&config_file_opts);
  boost::program_options::detail::cmdline::~cmdline((cmdline *)&collider);
  std::__cxx11::string::string((string *)&collider,"help",(allocator *)&config_file_opts);
  sVar12 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count(local_8e0,(key_type *)&collider);
  std::__cxx11::string::~string((string *)&collider);
  if (sVar12 == 0) {
    std::__cxx11::string::string((string *)&collider,"version",(allocator *)&config_file_opts);
    sVar12 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::count(local_8e0,(key_type *)&collider);
    std::__cxx11::string::~string((string *)&collider);
    if (sVar12 == 0) {
      std::__cxx11::string::string((string *)&collider,"config-file",(allocator *)&config_file_opts)
      ;
      sVar12 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count(local_8e0,(key_type *)&collider);
      std::__cxx11::string::~string((string *)&collider);
      if (sVar12 != 0) {
        boost::program_options::options_description::options_description
                  (&config_file_opts,uVar2,uVar15);
        poVar11 = (options_description *)
                  boost::program_options::options_description::add(&config_file_opts);
        poVar11 = (options_description *)boost::program_options::options_description::add(poVar11);
        poVar11 = (options_description *)boost::program_options::options_description::add(poVar11);
        boost::program_options::options_description::add(poVar11);
        std::__cxx11::string::string((string *)&collider,"config-file",(allocator *)&local_968);
        operand = (any *)boost::program_options::abstract_variables_map::operator[]
                                   ((string *)&var_map);
        pvVar14 = boost::
                  any_cast<std::vector<boost::filesystem::path,std::allocator<boost::filesystem::path>>const&>
                            (operand);
        std::__cxx11::string::~string((string *)&collider);
        pbVar1 = &((pvVar14->
                   super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                   )._M_impl.super__Vector_impl_data._M_finish)->m_pathname;
        for (__rhs = &((pvVar14->
                       super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                       )._M_impl.super__Vector_impl_data._M_start)->m_pathname; __rhs != pbVar1;
            __rhs = __rhs + 1) {
          bVar3 = boost::filesystem::exists((path *)__rhs);
          if (!bVar3) {
            this_00 = (error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_968,"configuration file \'",__rhs);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &collider,&local_968,"\' not found");
            boost::program_options::error::error(this_00,(string *)&collider);
            __cxa_throw(this_00,&boost::program_options::error::typeinfo,
                        std::logic_error::~logic_error);
          }
          boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
                    ((basic_ifstream<char,_std::char_traits<char>_> *)&collider,(path *)__rhs);
          boost::program_options::parse_config_file<char>
                    ((istream *)&local_968,(options_description *)&collider,
                     SUB81(&config_file_opts,0));
          boost::program_options::store((basic_parsed_options *)&local_968,&var_map,false);
          std::
          vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
          ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                     *)&local_968);
          boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::~basic_ifstream
                    ((basic_ifstream<char,_std::char_traits<char>_> *)&collider);
        }
        boost::program_options::options_description::~options_description(&config_file_opts);
      }
      boost::program_options::notify(&var_map);
      glauber::Collider::Collider(&collider,&var_map);
      glauber::Collider::run_events(&collider);
      glauber::Collider::~Collider(&collider);
    }
    else {
      poVar13 = std::operator<<((ostream *)&std::cout,"glauber ");
      poVar13 = std::operator<<(poVar13,"1.0.0");
      std::operator<<(poVar13,'\n');
    }
  }
  else {
    poVar13 = std::operator<<((ostream *)&std::cout,(string *)&usage_str);
    poVar13 = std::operator<<(poVar13,
                              "\nprojectile = { p | d | Cu | Cu2 | Au | Au2 | Pb | U | U2 | U3 }\n")
    ;
    poVar13 = (ostream *)boost::program_options::operator<<(poVar13,&usage_opts);
    std::operator<<(poVar13,"\nsee the online documentation for complete usage information\n");
  }
  boost::program_options::variables_map::~variables_map(&var_map);
  std::__cxx11::string::~string((string *)&usage_str);
  boost::program_options::options_description::~options_description(&all_opts);
  boost::program_options::options_description::~options_description(&usage_opts);
  boost::program_options::options_description::~options_description(&grid_opts);
  boost::program_options::options_description::~options_description(&phys_opts);
  boost::program_options::options_description::~options_description(&output_opts);
  boost::program_options::options_description::~options_description(&general_opts);
  boost::program_options::positional_options_description::~positional_options_description
            (&positional_opts);
  boost::program_options::options_description::~options_description(&main_opts);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  using namespace glauber;

  // Parse options with boost::program_options.
  // There are quite a few options, so let's separate them into logical groups.
  using OptDesc = po::options_description;

  using VecStr = std::vector<std::string>;
  OptDesc main_opts{};
  main_opts.add_options()
    ("projectile", po::value<VecStr>()->required()->
     notifier(  // use a lambda to verify there are exactly two projectiles
         [](const VecStr& projectiles) {
           if (projectiles.size() != 2)
            throw po::required_option{"projectile"};
           }),
     "projectile symbols")
    ("number-events", po::value<int>()->default_value(1),
     "number of events");

  // Make all main arguments positional.
  po::positional_options_description positional_opts{};
  positional_opts
    .add("projectile", 2)
    .add("number-events", 1);

  using VecPath = std::vector<fs::path>;
  OptDesc general_opts{"general options"};
  general_opts.add_options()
    ("help,h", "show this help message and exit")
    ("version", "print version information and exit")
    ("config-file,c", po::value<VecPath>()->value_name("FILE"),
     "configuration file\n(can be passed multiple times)");

  OptDesc output_opts{"output options"};
  output_opts.add_options()
    ("quiet,q", po::bool_switch(),
     "do not print event properties to stdout")
    ("output,o", po::value<fs::path>()->value_name("PATH"),
     "HDF5 file or directory for text files");

  OptDesc phys_opts{"physical options"};
  phys_opts.add_options()
    ("alpha,a",
     po::value<double>()->value_name("FLOAT")->default_value(0., "0"),
     "binary collision fraction")
    ("fluctuation,k",
     po::value<double>()->value_name("FLOAT")->default_value(1., "1"),
     "gamma fluctuation shape parameter")
    // ("beam-energy,e",
    //  po::value<double>()->value_name("FLOAT")->default_value(2760., "2760"),
    //  "beam energy sqrt(s) [GeV]")
    ("nucleon-width,w",
     po::value<double>()->value_name("FLOAT")->default_value(.5, "0.5"),
     "Gaussian nucleon width [fm]")
    ("cross-section,x",
     po::value<double>()->value_name("FLOAT")->default_value(6.4, "6.4"),
     "inelastic nucleon-nucleon cross section sigma_NN [fm^2]")
    ("normalization,n",
     po::value<double>()->value_name("FLOAT")->default_value(1., "1"),
     "normalization factor")
    ("b-min",
     po::value<double>()->value_name("FLOAT")->default_value(0., "0"),
     "minimum impact parameter [fm]")
    ("b-max",
     po::value<double>()->value_name("FLOAT")->default_value(-1., "auto"),
     "maximum impact parameter [fm]")
    ("random-seed",
     po::value<int64_t>()->value_name("INT")->default_value(-1, "auto"),
     "random seed");

  OptDesc grid_opts{"grid options"};
  grid_opts.add_options()
    ("grid-max",
     po::value<double>()->value_name("FLOAT")->default_value(10., "10.0"),
     "xy max [fm]\n(grid extends from -max to +max)")
    ("grid-step",
     po::value<double>()->value_name("FLOAT")->default_value(0.2, "0.2"),
     "step size [fm]");

  // Make a meta-group containing all the option groups except the main
  // positional options (don't want the auto-generated usage info for those).
  OptDesc usage_opts{};
  usage_opts
    .add(general_opts)
    .add(output_opts)
    .add(phys_opts)
    .add(grid_opts);

  // Now a meta-group containing _all_ options.
  OptDesc all_opts{};
  all_opts
    .add(usage_opts)
    .add(main_opts);

  // Will be used several times.
  const std::string usage_str{
    "usage: glauber [options] projectile projectile [number-events = 1]\n"};

  try {
    // Initialize a VarMap (boost::program_options::variables_map).
    // It will contain all configuration values.
    VarMap var_map{};

    // Parse command line options.
    po::store(po::command_line_parser(argc, argv)
        .options(all_opts).positional(positional_opts).run(), var_map);

    // Handle options that imply immediate exit.
    // Must do this _before_ po::notify() since that can throw exceptions.
    if (var_map.count("help")) {
      std::cout
        << usage_str
        << "\n"
           "projectile = { p | d | Cu | Cu2 | Au | Au2 | Pb | U | U2 | U3 }\n"
        << usage_opts
        << "\n"
           "see the online documentation for complete usage information\n";
      return 0;
    }
    if (var_map.count("version")) {
      std::cout << "glauber " << GLAUBER_VERSION_STRING << '\n';
      return 0;
    }

    // Merge any config files.
    if (var_map.count("config-file")) {
      // Everything except general_opts.
      OptDesc config_file_opts{};
      config_file_opts
        .add(main_opts)
        .add(output_opts)
        .add(phys_opts)
        .add(grid_opts);

      for (const auto& path : var_map["config-file"].as<VecPath>()) {
        if (!fs::exists(path)) {
          throw po::error{
            "configuration file '" + path.string() + "' not found"};
        }
        fs::ifstream ifs{path};
        po::store(po::parse_config_file(ifs, config_file_opts), var_map);
      }
    }

    // Save all the final values into var_map.
    // Exceptions may occur here.
    po::notify(var_map);

    // Go!
    Collider collider{var_map};
    collider.run_events();
  }
  catch (const po::required_option&) {
    // Handle this exception separately from others.
    // This occurs e.g. when the program is excuted with no arguments.
    std::cerr << usage_str << "run 'glauber --help' for more information\n";
    return 1;
  }
  catch (const std::exception& e) {
    // For all other exceptions just output the error message.
    std::cerr << e.what() << '\n';
    return 1;
  }

  return 0;
}